

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psi.cpp
# Opt level: O2

void __thiscall
pg::PSISolver::compute_val(PSISolver *this,WorkerP *__lace_worker,Task *__lace_dq_head,int v)

{
  void *__dest;
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  
  lVar5 = (long)v;
  *(undefined4 *)(done + lVar5 * 4) = 1;
  iVar3 = *(int *)(str + lVar5 * 4);
  __dest = (void *)(val + (long)(int)(v * k) * 4);
  if (((long)iVar3 == -1) || (*(int *)(halt + (long)iVar3 * 4) != 0)) {
    memset(__dest,0,(ulong)k << 2);
  }
  else {
    memcpy(__dest,(void *)(val + (long)(int)(iVar3 * k) * 4),(ulong)k << 2);
  }
  iVar4 = 0;
  piVar1 = (int *)((long)__dest + (long)((this->super_Solver).game)->_priority[lVar5] * 4);
  *piVar1 = *piVar1 + 1;
  iVar3 = *(int *)(first_in + lVar5 * 4);
  do {
    if (iVar3 == -1) {
LAB_0014ff4b:
      for (; __lace_dq_head = __lace_dq_head + -1, iVar4 != 0; iVar4 = iVar4 + 1) {
        compute_val_SYNC(__lace_worker,__lace_dq_head);
      }
      return;
    }
    iVar2 = *(int *)(next_in + (long)iVar3 * 4);
    if (iVar2 == -1) {
      compute_val(this,__lace_worker,__lace_dq_head,iVar3);
      goto LAB_0014ff4b;
    }
    compute_val_SPAWN(__lace_worker,__lace_dq_head,iVar3,this);
    __lace_dq_head = __lace_dq_head + 1;
    iVar4 = iVar4 + -1;
    iVar3 = iVar2;
  } while( true );
}

Assistant:

void
PSISolver::compute_val(WorkerP* __lace_worker, Task* __lace_dq_head, int v)
{
    // mark node as visited
    done[v] = 1;

    // compute valuation of current node
    int st = str[v];
    int *dst = val + k*v;
    if (st == -1 or halt[st]) memset(dst, 0, sizeof(int[k]));
    else memcpy(dst, val + k*st, sizeof(int[k])); // copy from successor
    dst[priority(v)]++;

    // recursively update predecessor positions
    int count = 0;
    int from = first_in[v];
    while (from != -1) {
        int next = next_in[from];
        if (next != -1) {
            SPAWN(compute_val, from, this);
            count++;
        } else {
            CALL(compute_val, from, this);
            break;
        }
        from = next;
    }

    while (count--) {
        SYNC(compute_val);
    }
}